

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_argument
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  uint uVar1;
  ngx_int_t nVar2;
  undefined1 local_20 [8];
  ngx_str_t value;
  
  nVar2 = ngx_http_arg(r,(u_char *)(*(long *)(data + 8) + 4),*(long *)data - 4,(ngx_str_t *)local_20
                      );
  if (nVar2 == 0) {
    v->data = (u_char *)value.len;
    uVar1 = (local_20._0_4_ & 0xfffffff) + (*(uint *)v & 0x80000000) + 0x10000000;
  }
  else {
    uVar1 = *(uint *)v | 0x40000000;
  }
  *(uint *)v = uVar1;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_argument(ngx_http_request_t *r, ngx_http_variable_value_t *v,
    uintptr_t data)
{
    ngx_str_t *name = (ngx_str_t *) data;

    u_char     *arg;
    size_t      len;
    ngx_str_t   value;

    len = name->len - (sizeof("arg_") - 1);
    arg = name->data + sizeof("arg_") - 1;

    if (ngx_http_arg(r, arg, len, &value) != NGX_OK) {
        v->not_found = 1;
        return NGX_OK;
    }

    v->data = value.data;
    v->len = value.len;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    return NGX_OK;
}